

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

void nn_sock_stat_increment(nn_sock *self,int name,int64_t increment)

{
  int iVar1;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  bool bVar2;
  
  if (in_ESI == 0x65) {
    if (in_RDX < 1) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","increment > 0",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x409);
      fflush(_stderr);
      nn_err_abort();
    }
    *(long *)(in_RDI + 400) = in_RDX + *(long *)(in_RDI + 400);
  }
  else if (in_ESI == 0x66) {
    if (in_RDX < 1) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","increment > 0",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x40d);
      fflush(_stderr);
      nn_err_abort();
    }
    *(long *)(in_RDI + 0x198) = in_RDX + *(long *)(in_RDI + 0x198);
  }
  else if (in_ESI == 0x67) {
    if (in_RDX < 1) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","increment > 0",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x411);
      fflush(_stderr);
      nn_err_abort();
    }
    *(long *)(in_RDI + 0x1a0) = in_RDX + *(long *)(in_RDI + 0x1a0);
  }
  else if (in_ESI == 0x68) {
    if (in_RDX < 1) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","increment > 0",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x415);
      fflush(_stderr);
      nn_err_abort();
    }
    *(long *)(in_RDI + 0x1a8) = in_RDX + *(long *)(in_RDI + 0x1a8);
  }
  else if (in_ESI == 0x69) {
    if (in_RDX < 1) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","increment > 0",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x419);
      fflush(_stderr);
      nn_err_abort();
    }
    *(long *)(in_RDI + 0x1b0) = in_RDX + *(long *)(in_RDI + 0x1b0);
  }
  else if (in_ESI == 0x6a) {
    if (in_RDX < 1) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","increment > 0",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x41d);
      fflush(_stderr);
      nn_err_abort();
    }
    *(long *)(in_RDI + 0x1b8) = in_RDX + *(long *)(in_RDI + 0x1b8);
  }
  else if (in_ESI == 0x6b) {
    if (in_RDX < 1) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","increment > 0",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x421);
      fflush(_stderr);
      nn_err_abort();
    }
    *(long *)(in_RDI + 0x1c0) = in_RDX + *(long *)(in_RDI + 0x1c0);
  }
  else {
    iVar1 = (int)in_RDX;
    if (in_ESI == 0xc9) {
      bVar2 = true;
      if (in_RDX < 1) {
        bVar2 = -in_RDX <= (long)*(int *)(in_RDI + 0x1e8);
      }
      if (!bVar2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "increment > 0 || self->statistics.current_connections >= -increment",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x437);
        fflush(_stderr);
        nn_err_abort();
      }
      if (0x7ffffffe < in_RDX || in_RDX < -0x7ffffffe) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "increment < INT_MAX && increment > -INT_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x438);
        fflush(_stderr);
        nn_err_abort();
      }
      *(int *)(in_RDI + 0x1e8) = iVar1 + *(int *)(in_RDI + 0x1e8);
    }
    else if (in_ESI == 0xca) {
      bVar2 = true;
      if (in_RDX < 1) {
        bVar2 = -in_RDX <= (long)*(int *)(in_RDI + 0x1ec);
      }
      if (!bVar2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "increment > 0 || self->statistics.inprogress_connections >= -increment",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x43d);
        fflush(_stderr);
        nn_err_abort();
      }
      if (0x7ffffffe < in_RDX || in_RDX < -0x7ffffffe) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "increment < INT_MAX && increment > -INT_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x43e);
        fflush(_stderr);
        nn_err_abort();
      }
      *(int *)(in_RDI + 0x1ec) = iVar1 + *(int *)(in_RDI + 0x1ec);
    }
    else if (in_ESI == 0xcb) {
      bVar2 = true;
      if (in_RDX < 1) {
        bVar2 = -in_RDX <= (long)*(int *)(in_RDI + 500);
      }
      if (!bVar2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "increment > 0 || self->statistics.current_ep_errors >= -increment",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x448);
        fflush(_stderr);
        nn_err_abort();
      }
      if (0x7ffffffe < in_RDX || in_RDX < -0x7ffffffe) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "increment < INT_MAX && increment > -INT_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x449);
        fflush(_stderr);
        nn_err_abort();
      }
      *(int *)(in_RDI + 500) = iVar1 + *(int *)(in_RDI + 500);
    }
    else if (in_ESI == 0x12d) {
      if (in_RDX < 1) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","increment > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x425);
        fflush(_stderr);
        nn_err_abort();
      }
      *(long *)(in_RDI + 0x1c8) = in_RDX + *(long *)(in_RDI + 0x1c8);
    }
    else if (in_ESI == 0x12e) {
      if (in_RDX < 1) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","increment > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x429);
        fflush(_stderr);
        nn_err_abort();
      }
      *(long *)(in_RDI + 0x1d0) = in_RDX + *(long *)(in_RDI + 0x1d0);
    }
    else if (in_ESI == 0x12f) {
      if (in_RDX < 0) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","increment >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x42d);
        fflush(_stderr);
        nn_err_abort();
      }
      *(long *)(in_RDI + 0x1d8) = in_RDX + *(long *)(in_RDI + 0x1d8);
    }
    else if (in_ESI == 0x130) {
      if (in_RDX < 0) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","increment >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x431);
        fflush(_stderr);
        nn_err_abort();
      }
      *(long *)(in_RDI + 0x1e0) = in_RDX + *(long *)(in_RDI + 0x1e0);
    }
    else if (in_ESI == 0x191) {
      if ((in_RDX < 1) || (bVar2 = true, 0x10 < in_RDX)) {
        bVar2 = in_RDX == -1;
      }
      if (!bVar2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "(increment > 0 && increment <= 16) || increment == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x443);
        fflush(_stderr);
        nn_err_abort();
      }
      *(int *)(in_RDI + 0x1f0) = iVar1;
    }
  }
  return;
}

Assistant:

void nn_sock_stat_increment (struct nn_sock *self, int name, int64_t increment)
{
    switch (name) {
        case NN_STAT_ESTABLISHED_CONNECTIONS:
            nn_assert (increment > 0);
            self->statistics.established_connections += increment;
            break;
        case NN_STAT_ACCEPTED_CONNECTIONS:
            nn_assert (increment > 0);
            self->statistics.accepted_connections += increment;
            break;
        case NN_STAT_DROPPED_CONNECTIONS:
            nn_assert (increment > 0);
            self->statistics.dropped_connections += increment;
            break;
        case NN_STAT_BROKEN_CONNECTIONS:
            nn_assert (increment > 0);
            self->statistics.broken_connections += increment;
            break;
        case NN_STAT_CONNECT_ERRORS:
            nn_assert (increment > 0);
            self->statistics.connect_errors += increment;
            break;
        case NN_STAT_BIND_ERRORS:
            nn_assert (increment > 0);
            self->statistics.bind_errors += increment;
            break;
        case NN_STAT_ACCEPT_ERRORS:
            nn_assert (increment > 0);
            self->statistics.accept_errors += increment;
            break;
        case NN_STAT_MESSAGES_SENT:
            nn_assert (increment > 0);
            self->statistics.messages_sent += increment;
            break;
        case NN_STAT_MESSAGES_RECEIVED:
            nn_assert (increment > 0);
            self->statistics.messages_received += increment;
            break;
        case NN_STAT_BYTES_SENT:
            nn_assert (increment >= 0);
            self->statistics.bytes_sent += increment;
            break;
        case NN_STAT_BYTES_RECEIVED:
            nn_assert (increment >= 0);
            self->statistics.bytes_received += increment;
            break;

        case NN_STAT_CURRENT_CONNECTIONS:
            nn_assert (increment > 0 ||
                self->statistics.current_connections >= -increment);
            nn_assert(increment < INT_MAX && increment > -INT_MAX);
            self->statistics.current_connections += (int) increment;
            break;
        case NN_STAT_INPROGRESS_CONNECTIONS:
            nn_assert (increment > 0 ||
                self->statistics.inprogress_connections >= -increment);
            nn_assert(increment < INT_MAX && increment > -INT_MAX);
            self->statistics.inprogress_connections += (int) increment;
            break;
        case NN_STAT_CURRENT_SND_PRIORITY:
            /*  This is an exception, we don't want to increment priority  */
            nn_assert((increment > 0 && increment <= 16) || increment == -1);
            self->statistics.current_snd_priority = (int) increment;
            break;
        case NN_STAT_CURRENT_EP_ERRORS:
            nn_assert (increment > 0 ||
                self->statistics.current_ep_errors >= -increment);
            nn_assert(increment < INT_MAX && increment > -INT_MAX);
            self->statistics.current_ep_errors += (int) increment;
            break;
    }
}